

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O0

void modifier_reset(png_modifier *pm)

{
  png_modifier *pm_local;
  
  store_read_reset(&pm->this);
  pm->limit = 0.004;
  pm->pending_chunk = 0;
  pm->pending_len = 0;
  pm->buffer_position = 0;
  pm->buffer_count = 0;
  pm->flush = 0;
  pm->modifications = (png_modification *)0x0;
  pm->state = modifier_start;
  modifier_encoding_iterate(pm);
  pm->field_0x598 = pm->field_0x598 & 0xfd;
  pm->current_gamma = 0.0;
  pm->current_encoding = (color_encoding *)0x0;
  pm->encoding_ignored = 0;
  pm->colour_type = '\0';
  pm->bit_depth = '\0';
  return;
}

Assistant:

static void
modifier_reset(png_modifier *pm)
{
   store_read_reset(&pm->this);
   pm->limit = 4E-3;
   pm->pending_len = pm->pending_chunk = 0;
   pm->flush = pm->buffer_count = pm->buffer_position = 0;
   pm->modifications = NULL;
   pm->state = modifier_start;
   modifier_encoding_iterate(pm);
   /* The following must be set in the next run.  In particular
    * test_uses_encodings must be set in the _ini function of each transform
    * that looks at the encodings.  (Not the 'add' function!)
    */
   pm->test_uses_encoding = 0;
   pm->current_gamma = 0;
   pm->current_encoding = 0;
   pm->encoding_ignored = 0;
   /* These only become value after IHDR is read: */
   pm->bit_depth = pm->colour_type = 0;
}